

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

void helper_msa_st_h_mips64(CPUMIPSState_conflict5 *env,uint32_t wd,target_ulong addr)

{
  int mmu_idx_00;
  uint idx;
  TCGMemOpIdx oi_00;
  fpr_t *pfVar1;
  uintptr_t unaff_retaddr;
  TCGMemOpIdx oi;
  int mmu_idx;
  wr_t *pwd;
  target_ulong addr_local;
  uint32_t wd_local;
  CPUMIPSState_conflict5 *env_local;
  
  pfVar1 = (env->active_fpu).fpr + wd;
  mmu_idx_00 = cpu_mmu_index(env,false);
  idx = cpu_mmu_index(env,false);
  oi_00 = make_memop_idx(MO_AMASK|MO_BEUW,idx);
  ensure_writable_pages(env,addr,mmu_idx_00,unaff_retaddr);
  helper_be_stw_mmu_mips64
            ((CPUArchState_conflict10 *)env,addr,*(uint16_t *)pfVar1,oi_00,unaff_retaddr);
  helper_be_stw_mmu_mips64
            ((CPUArchState_conflict10 *)env,addr + 2,*(uint16_t *)((long)pfVar1 + 2),oi_00,
             unaff_retaddr);
  helper_be_stw_mmu_mips64
            ((CPUArchState_conflict10 *)env,addr + 4,*(uint16_t *)((long)pfVar1 + 4),oi_00,
             unaff_retaddr);
  helper_be_stw_mmu_mips64
            ((CPUArchState_conflict10 *)env,addr + 6,*(uint16_t *)((long)pfVar1 + 6),oi_00,
             unaff_retaddr);
  helper_be_stw_mmu_mips64
            ((CPUArchState_conflict10 *)env,addr + 8,*(uint16_t *)((long)pfVar1 + 8),oi_00,
             unaff_retaddr);
  helper_be_stw_mmu_mips64
            ((CPUArchState_conflict10 *)env,addr + 10,*(uint16_t *)((long)pfVar1 + 10),oi_00,
             unaff_retaddr);
  helper_be_stw_mmu_mips64
            ((CPUArchState_conflict10 *)env,addr + 0xc,*(uint16_t *)((long)pfVar1 + 0xc),oi_00,
             unaff_retaddr);
  helper_be_stw_mmu_mips64
            ((CPUArchState_conflict10 *)env,addr + 0xe,*(uint16_t *)((long)pfVar1 + 0xe),oi_00,
             unaff_retaddr);
  return;
}

Assistant:

void helper_msa_st_h(CPUMIPSState *env, uint32_t wd,
                     target_ulong addr)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    int mmu_idx = cpu_mmu_index(env, false);

    MEMOP_IDX(DF_HALF)
    ensure_writable_pages(env, addr, mmu_idx, GETPC());
#if !defined(HOST_WORDS_BIGENDIAN)
    helper_ret_stw_mmu(env, addr + (0 << DF_HALF), pwd->h[0], oi, GETPC());
    helper_ret_stw_mmu(env, addr + (1 << DF_HALF), pwd->h[1], oi, GETPC());
    helper_ret_stw_mmu(env, addr + (2 << DF_HALF), pwd->h[2], oi, GETPC());
    helper_ret_stw_mmu(env, addr + (3 << DF_HALF), pwd->h[3], oi, GETPC());
    helper_ret_stw_mmu(env, addr + (4 << DF_HALF), pwd->h[4], oi, GETPC());
    helper_ret_stw_mmu(env, addr + (5 << DF_HALF), pwd->h[5], oi, GETPC());
    helper_ret_stw_mmu(env, addr + (6 << DF_HALF), pwd->h[6], oi, GETPC());
    helper_ret_stw_mmu(env, addr + (7 << DF_HALF), pwd->h[7], oi, GETPC());
#else
    helper_ret_stw_mmu(env, addr + (3 << DF_HALF), pwd->h[0], oi, GETPC());
    helper_ret_stw_mmu(env, addr + (2 << DF_HALF), pwd->h[1], oi, GETPC());
    helper_ret_stw_mmu(env, addr + (1 << DF_HALF), pwd->h[2], oi, GETPC());
    helper_ret_stw_mmu(env, addr + (0 << DF_HALF), pwd->h[3], oi, GETPC());
    helper_ret_stw_mmu(env, addr + (7 << DF_HALF), pwd->h[4], oi, GETPC());
    helper_ret_stw_mmu(env, addr + (6 << DF_HALF), pwd->h[5], oi, GETPC());
    helper_ret_stw_mmu(env, addr + (5 << DF_HALF), pwd->h[6], oi, GETPC());
    helper_ret_stw_mmu(env, addr + (4 << DF_HALF), pwd->h[7], oi, GETPC());
#endif
}